

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libmeshb7.c
# Opt level: O1

int GmfSetKwd(int64_t MshIdx,int KwdCod,int64_t NmbLin,...)

{
  long lVar1;
  char *__s1;
  char in_AL;
  int iVar2;
  long lVar3;
  undefined4 *puVar4;
  undefined8 in_RCX;
  ulong uVar5;
  ulong uVar6;
  long in_R8;
  undefined8 in_R9;
  uint uVar7;
  long lVar8;
  uint *puVar9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list VarArg;
  int local_120;
  undefined4 local_11c;
  ulong local_118;
  undefined4 *local_110;
  undefined1 *local_108;
  int local_f4;
  long local_f0;
  undefined1 local_e8 [24];
  undefined8 local_d0;
  long local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  uVar7 = 0;
  local_f4 = KwdCod;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  RecBlk((GmfMshSct *)MshIdx,*(void **)(MshIdx + 0x300428),0);
  if (0xffffff0f < KwdCod - 0xf1U) {
    uVar6 = (ulong)(uint)KwdCod;
    lVar1 = MshIdx + uVar6 * 0x3300;
    puVar9 = (uint *)(lVar1 + 0x110);
    __s1 = GmfKwdFmt[uVar6][2];
    iVar2 = strcmp(__s1,"sr");
    if ((iVar2 == 0) || (iVar2 = strcmp(__s1,"hr"), iVar2 == 0)) {
      local_108 = local_e8;
      local_110 = (undefined4 *)&stack0x00000008;
      *(undefined4 *)(lVar1 + 0x124) = (undefined4)local_d0;
      local_118 = 0x3000000028;
      if (*(int *)(lVar1 + 0x124) < 1) {
        lVar3 = 0;
      }
      else {
        lVar3 = 0;
        do {
          *(undefined4 *)(lVar1 + 0x128 + lVar3 * 4) = *(undefined4 *)(local_c8 + lVar3 * 4);
          lVar3 = lVar3 + 1;
        } while (lVar3 < *(int *)(lVar1 + 0x124));
      }
      local_11c = (undefined4)lVar3;
      iVar2 = strcmp("hr",GmfKwdFmt[uVar6][2]);
      if (iVar2 == 0) {
        uVar5 = local_118 & 0xffffffff;
        if (uVar5 < 0x29) {
          local_118 = CONCAT44(local_118._4_4_,(int)local_118 + 8);
          puVar4 = (undefined4 *)(local_108 + uVar5);
        }
        else {
          puVar4 = local_110;
          local_110 = local_110 + 2;
        }
        *(undefined4 *)(lVar1 + 0x114) = *puVar4;
        uVar5 = local_118 & 0xffffffff;
        if (uVar5 < 0x29) {
          local_118 = CONCAT44(local_118._4_4_,(int)local_118 + 8);
          puVar4 = (undefined4 *)(local_108 + uVar5);
        }
        else {
          puVar4 = local_110;
          local_110 = local_110 + 2;
        }
        *(undefined4 *)(lVar1 + 0x118) = *puVar4;
      }
    }
    ExpFmt((GmfMshSct *)MshIdx,KwdCod);
    uVar7 = *puVar9;
    if ((ulong)uVar7 != 0) {
      uVar5 = (ulong)uVar7;
      if (uVar7 != 1) {
        uVar5 = NmbLin;
      }
      *(ulong *)(lVar1 + 0x10d8) = uVar5;
      if (((*(byte *)(MshIdx + 0xc) & 2) != 0) && (*(long *)(MshIdx + 0x30) != 0)) {
        lVar3 = ftell(*(FILE **)(MshIdx + 0x300410));
        iVar2 = fseek(*(FILE **)(MshIdx + 0x300410),*(long *)(MshIdx + 0x30),0);
        if (iVar2 != 0) {
          return 0;
        }
        SetPos((GmfMshSct *)MshIdx,lVar3);
        iVar2 = fseek(*(FILE **)(MshIdx + 0x300410),lVar3,0);
        if (iVar2 != 0) {
          return 0;
        }
      }
      if ((*(byte *)(MshIdx + 0xc) & 1) == 0) {
        RecWrd((GmfMshSct *)MshIdx,&local_f4);
        lVar3 = ftell(*(FILE **)(MshIdx + 0x300410));
        *(long *)(MshIdx + 0x30) = lVar3;
        SetPos((GmfMshSct *)MshIdx,0);
        if (*puVar9 != 1) {
          if (*(int *)(MshIdx + 4) < 4) {
            local_11c = *(undefined4 *)(lVar1 + 0x10d8);
            RecWrd((GmfMshSct *)MshIdx,&local_11c);
          }
          else {
            RecDblWrd((GmfMshSct *)MshIdx,(undefined4 *)(lVar1 + 0x10d8));
          }
        }
        if (*puVar9 == 3) {
          RecWrd((GmfMshSct *)MshIdx,(void *)(lVar1 + 0x124));
          if (*(int *)(lVar1 + 0x124) < 1) {
            lVar3 = 0;
          }
          else {
            lVar3 = 0;
            do {
              local_120 = *(int *)(lVar1 + 0x128 + lVar3 * 4);
              if (4 < local_120) {
                local_120 = 1;
              }
              RecWrd((GmfMshSct *)MshIdx,&local_120);
              lVar3 = lVar3 + 1;
            } while (lVar3 < *(int *)(lVar1 + 0x124));
          }
          local_11c = (undefined4)lVar3;
          iVar2 = strcmp("hr",GmfKwdFmt[local_f4][2]);
          if (iVar2 == 0) {
            RecWrd((GmfMshSct *)MshIdx,(void *)(lVar1 + 0x114));
            RecWrd((GmfMshSct *)MshIdx,(void *)(lVar1 + 0x118));
          }
        }
      }
      else {
        lVar3 = uVar6 * 3;
        fprintf(*(FILE **)(MshIdx + 0x300410),"\n%s\n",GmfKwdFmt[uVar6][0]);
        if (*puVar9 != 1) {
          fprintf(*(FILE **)(MshIdx + 0x300410),"%ld\n",*(undefined8 *)(lVar1 + 0x10d8));
        }
        if (*puVar9 == 3) {
          lVar8 = 0;
          fprintf(*(FILE **)(MshIdx + 0x300410),"%d ",(ulong)*(uint *)(lVar1 + 0x124));
          if (0 < *(int *)(lVar1 + 0x124)) {
            lVar8 = 0;
            local_f0 = lVar3;
            do {
              uVar7 = *(uint *)(lVar1 + 0x128 + lVar8 * 4);
              uVar6 = (ulong)uVar7;
              if (4 < (int)uVar7) {
                uVar6 = 1;
              }
              local_120 = (int)uVar6;
              fprintf(*(FILE **)(MshIdx + 0x300410),"%d ",uVar6);
              lVar8 = lVar8 + 1;
              lVar3 = local_f0;
            } while (lVar8 < *(int *)(lVar1 + 0x124));
          }
          local_11c = (undefined4)lVar8;
          fputc(10,*(FILE **)(MshIdx + 0x300410));
        }
        iVar2 = strcmp("hr",GmfKwdFmt[0][lVar3 + 2]);
        if (iVar2 == 0) {
          fprintf(*(FILE **)(MshIdx + 0x300410),"%d %d\n",(ulong)*(uint *)(lVar1 + 0x114),
                  (ulong)*(uint *)(lVar1 + 0x118));
        }
      }
      *(undefined8 *)(MshIdx + 0x40) = 0;
      *(long *)(MshIdx + 0x38) =
           *(long *)(MshIdx + 0x38) + (long)*(int *)(lVar1 + 0x120) * *(long *)(lVar1 + 0x10d8) * 4;
      uVar7 = 1;
    }
  }
  return uVar7;
}

Assistant:

int GmfSetKwd(int64_t MshIdx, int KwdCod, int64_t NmbLin, ...)
{
   int         i, typ, *TypTab;
   int64_t     CurPos;
   va_list     VarArg;
   GmfMshSct   *msh = (GmfMshSct *)MshIdx;
   KwdSct      *kwd;

   RecBlk(msh, msh->buf, 0);

   if( (KwdCod < 1) || (KwdCod > GmfMaxKwd) )
      return(0);

   kwd = &msh->KwdTab[ KwdCod ];

   // Read further arguments if this kw is a solution
   if(!strcmp(GmfKwdFmt[ KwdCod ][2], "sr")
   || !strcmp(GmfKwdFmt[ KwdCod ][2], "hr"))
   {
      va_start(VarArg, NmbLin);

      kwd->NmbTyp = va_arg(VarArg, int);
      TypTab = va_arg(VarArg, int *);

      for(i=0;i<kwd->NmbTyp;i++)
         kwd->TypTab[i] = TypTab[i];

      // Add two extra paramaters for HO elements: degree and nmb nodes
      if(!strcmp("hr", GmfKwdFmt[ KwdCod ][2]))
      {
         kwd->deg = va_arg(VarArg, int);
         kwd->NmbNod = va_arg(VarArg, int);
      }

      va_end(VarArg);
   }

   // Setup the kwd info
   ExpFmt(msh, KwdCod);

   if(!kwd->typ)
      return(0);
   else if(kwd->typ == InfKwd)
      kwd->NmbLin = 1;
   else
      kwd->NmbLin = NmbLin;

   // Store the next kwd position in binary file
   if( (msh->typ & Bin) && msh->NexKwdPos )
   {
      CurPos = GetFilPos(msh);

      if(!SetFilPos(msh, msh->NexKwdPos))
         return(0);

      SetPos(msh, CurPos);

      if(!SetFilPos(msh, CurPos))
         return(0);
   }

   // Write the header
   if(msh->typ & Asc)
   {
      fprintf(msh->hdl, "\n%s\n", GmfKwdFmt[ KwdCod ][0]);

      if(kwd->typ != InfKwd)
         fprintf(msh->hdl, INT64_T_FMT"\n", kwd->NmbLin);

      // In case of solution field, write the extended header
      if(kwd->typ == SolKwd)
      {
         fprintf(msh->hdl, "%d ", kwd->NmbTyp);

         for(i=0;i<kwd->NmbTyp;i++)
         {
            typ = kwd->TypTab[i] > GmfMat ? GmfSca : kwd->TypTab[i];
            fprintf(msh->hdl, "%d ", typ);
         }

         fprintf(msh->hdl, "\n");
      }

      if(!strcmp("hr", GmfKwdFmt[ KwdCod ][2]))
         fprintf(msh->hdl, "%d %d\n", kwd->deg, kwd->NmbNod);
   }
   else
   {
      RecWrd(msh, (unsigned char *)&KwdCod);
      msh->NexKwdPos = GetFilPos(msh);
      SetPos(msh, 0);

      if(kwd->typ != InfKwd)
      {
         if(msh->ver < 4)
         {
            i = (int)kwd->NmbLin;
            RecWrd(msh, (unsigned char *)&i);
         }
         else
            RecDblWrd(msh, (unsigned char *)&kwd->NmbLin);
      }

      // In case of solution field, write the extended header at once
      if(kwd->typ == SolKwd)
      {
         RecWrd(msh, (unsigned char *)&kwd->NmbTyp);

         for(i=0;i<kwd->NmbTyp;i++)
         {
            typ = kwd->TypTab[i] > GmfMat ? GmfSca : kwd->TypTab[i];
            RecWrd(msh, (unsigned char *)&typ);
         }

         if(!strcmp("hr", GmfKwdFmt[ KwdCod ][2]))
         {
            RecWrd(msh, (unsigned char *)&kwd->deg);
            RecWrd(msh, (unsigned char *)&kwd->NmbNod);
         }
      }
   }

   // Reset write buffer position
   msh->pos = 0;

   // Compute the total file size and check if it crosses the 2GB threshold
   msh->siz += kwd->NmbLin * kwd->NmbWrd * WrdSiz;

   return(1);
}